

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *
JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::New<Memory::Recycler>
          (Recycler *alloc,uint *buffer,int count)

{
  Recycler *alloc_00;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *this;
  TrackAllocData local_48;
  int local_1c;
  uint *puStack_18;
  int count_local;
  uint *buffer_local;
  Recycler *alloc_local;
  
  local_1c = count;
  puStack_18 = buffer;
  buffer_local = &alloc->Cookie;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,
             (type_info *)&ReadOnlyList<unsigned_int,Memory::Recycler,DefaultComparer>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
             ,0x46);
  alloc_00 = Memory::Recycler::TrackAllocInfo(alloc,&local_48);
  this = (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)
         new<Memory::Recycler>(0x20,alloc_00,0x446fd0);
  ReadOnlyList(this,puStack_18,local_1c,(Recycler *)buffer_local);
  return this;
}

Assistant:

static ReadOnlyList * New(UAllocator* alloc, __in_ecount(count) T* buffer, DECLSPEC_GUARD_OVERFLOW int count)
        {
            return AllocatorNew(UAllocator, alloc, ReadOnlyList, buffer, count, alloc);
        }